

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O0

int zip_central_dir_delete
              (mz_zip_internal_state *pState,int *deleted_entry_index_array,int entry_num)

{
  int iVar1;
  bool bVar2;
  int local_34;
  int local_30;
  int j;
  int k;
  int d_num;
  int end;
  int begin;
  int i;
  int entry_num_local;
  int *deleted_entry_index_array_local;
  mz_zip_internal_state *pState_local;
  
  end = 0;
  j = 0;
  while (end < entry_num) {
    while( true ) {
      iVar1 = end;
      bVar2 = false;
      if (end < entry_num) {
        bVar2 = deleted_entry_index_array[end] == 0;
      }
      if (!bVar2) break;
      end = end + 1;
    }
    while( true ) {
      bVar2 = false;
      if (end < entry_num) {
        bVar2 = deleted_entry_index_array[end] != 0;
      }
      if (!bVar2) break;
      end = end + 1;
    }
    zip_central_dir_move(pState,iVar1,end,entry_num);
  }
  end = 0;
  while (end < entry_num) {
    while( true ) {
      iVar1 = end;
      bVar2 = false;
      if (end < entry_num) {
        bVar2 = deleted_entry_index_array[end] == 0;
      }
      if (!bVar2) break;
      end = end + 1;
    }
    if (end == entry_num) break;
    while( true ) {
      bVar2 = false;
      if (end < entry_num) {
        bVar2 = deleted_entry_index_array[end] != 0;
      }
      if (!bVar2) break;
      end = end + 1;
    }
    local_30 = 0;
    for (local_34 = end; local_34 < entry_num; local_34 = local_34 + 1) {
      *(undefined4 *)((long)(pState->m_central_dir_offsets).m_p + (long)(iVar1 + local_30) * 4) =
           *(undefined4 *)((long)(pState->m_central_dir_offsets).m_p + (long)local_34 * 4);
      local_30 = local_30 + 1;
    }
    j = (end - iVar1) + j;
  }
  (pState->m_central_dir_offsets).m_size = (long)(entry_num - j) << 2;
  return 0;
}

Assistant:

static int zip_central_dir_delete(mz_zip_internal_state *pState,
                                  int *deleted_entry_index_array,
                                  int entry_num) {
  int i = 0;
  int begin = 0;
  int end = 0;
  int d_num = 0;
  while (i < entry_num) {
    while ((i < entry_num) && (!deleted_entry_index_array[i])) {
      i++;
    }
    begin = i;

    while ((i < entry_num) && (deleted_entry_index_array[i])) {
      i++;
    }
    end = i;
    zip_central_dir_move(pState, begin, end, entry_num);
  }

  i = 0;
  while (i < entry_num) {
    while ((i < entry_num) && (!deleted_entry_index_array[i])) {
      i++;
    }
    begin = i;
    if (begin == entry_num) {
      break;
    }
    while ((i < entry_num) && (deleted_entry_index_array[i])) {
      i++;
    }
    end = i;
    int k = 0, j;
    for (j = end; j < entry_num; j++) {
      MZ_ZIP_ARRAY_ELEMENT(&pState->m_central_dir_offsets, mz_uint32,
                           begin + k) =
          (mz_uint32)MZ_ZIP_ARRAY_ELEMENT(&pState->m_central_dir_offsets,
                                          mz_uint32, j);
      k++;
    }
    d_num += end - begin;
  }

  pState->m_central_dir_offsets.m_size =
      sizeof(mz_uint32) * (entry_num - d_num);
  return 0;
}